

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall jsonnet::internal::anon_unknown_0::Interpreter::decodeUTF8(Interpreter *this)

{
  Stack *this_00;
  double dVar1;
  char cVar2;
  pointer pFVar3;
  HeapEntity *pHVar4;
  _func_int **pp_Var5;
  HeapEntity *context;
  ostream *poVar6;
  RuntimeError *pRVar7;
  AST *unaff_R13;
  Value VVar8;
  stringstream ss;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_1a8 [23];
  
  this_00 = &this->stack;
  pFVar3 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pHVar4 = pFVar3[-1].val.v.h;
  do {
    pp_Var5 = pHVar4[1]._vptr_HeapEntity;
    if ((ulong)(*(long *)&pHVar4[1].mark - (long)pp_Var5 >> 3) <= (ulong)pFVar3[-1].elementId) {
      decode_utf8((UString *)local_1b8,&pFVar3[-1].bytes);
      VVar8 = makeString(this,(UString *)local_1b8);
      (this->scratch).t = STRING;
      (this->scratch).v = VVar8._0_8_;
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity * 4 + 4);
      }
      return (AST *)0x0;
    }
    context = (HeapEntity *)pp_Var5[pFVar3[-1].elementId];
    cVar2 = context->field_0xa;
    if (cVar2 == '\x01') {
      if (*(int *)&context[1]._vptr_HeapEntity != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"Element ",8);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," of the provided array was not a number",0x27);
        pRVar7 = (RuntimeError *)__cxa_allocate_exception(0x38);
        pFVar3 = (this->stack).stack.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::stringbuf::str();
        Stack::makeError(pRVar7,this_00,&pFVar3[-1].location,&local_1d8);
        __cxa_throw(pRVar7,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
      }
      dVar1 = *(double *)&context[1].mark;
      if ((((dVar1 < 0.0) || (255.0 < dVar1)) || (dVar1 != (double)(int)dVar1)) ||
         (NAN(dVar1) || NAN((double)(int)dVar1))) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"Element ",8);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," of the provided array was not an integer in range [0,255]",0x3a);
        pRVar7 = (RuntimeError *)__cxa_allocate_exception(0x38);
        pFVar3 = (this->stack).stack.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::stringbuf::str();
        Stack::makeError(pRVar7,this_00,&pFVar3[-1].location,&local_1d8);
        __cxa_throw(pRVar7,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
      }
      std::__cxx11::string::push_back((char)&pFVar3[-1].bytes);
      pFVar3[-1].elementId = pFVar3[-1].elementId + 1;
    }
    else {
      Stack::newCall(this_00,&pFVar3[-1].location,context,*(HeapObject **)&context[5].mark,
                     *(uint *)&context[6]._vptr_HeapEntity,(BindingFrame *)&context[2].mark);
      unaff_R13 = *(AST **)&context[6].mark;
    }
    if (cVar2 == '\0') {
      return unaff_R13;
    }
  } while( true );
}

Assistant:

const AST *decodeUTF8(void)
    {
        Frame &f = stack.top();
        const auto& elements = static_cast<HeapArray*>(f.val.v.h)->elements;
        while (f.elementId < elements.size()) {
            auto *th = elements[f.elementId];
            if (th->filled) {
                auto b = th->content;
                if (b.t != Value::NUMBER) {
                    std::stringstream ss;
                    ss << "Element " << f.elementId << " of the provided array was not a number";
                    throw makeError(stack.top().location, ss.str());
                } else {
                    double d = b.v.d;
                    if (d < 0 || d > 255 || d != int(d)) {
                        std::stringstream ss;
                        ss << "Element " << f.elementId << " of the provided array was not an integer in range [0,255]";
                        throw makeError(stack.top().location, ss.str());
                    }
                    f.bytes.push_back(uint8_t(d));
                }
                f.elementId++;
            } else {
                stack.newCall(f.location, th, th->self, th->offset, th->upValues);
                return th->body;
            }
        }
        scratch = makeString(decode_utf8(f.bytes));
        return nullptr;
    }